

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<int>,testing::Matcher<mp::func::Type>>,std::tuple<int,fmt::BasicStringRef<char>,int,mp::func::Type>>
               (tuple<testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                *matcher_tuple,
               tuple<int,_fmt::BasicStringRef<char>,_int,_mp::func::Type> *value_tuple)

{
  bool bVar1;
  tuple<int,_fmt::BasicStringRef<char>,_int,_mp::func::Type> *in_RDI;
  tuple<testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  *unaff_retaddr;
  int in_stack_0000000c;
  MatcherBase<int> *in_stack_00000010;
  undefined1 local_11;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<int>,testing::Matcher<mp::func::Type>>,std::tuple<int,fmt::BasicStringRef<char>,int,mp::func::Type>>
                    (unaff_retaddr,in_RDI);
  local_11 = false;
  if (bVar1) {
    std::
    get<2ul,testing::Matcher<int>,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<int>,testing::Matcher<mp::func::Type>>
              ((tuple<testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                *)0x1ada66);
    std::get<2ul,int,fmt::BasicStringRef<char>,int,mp::func::Type>
              ((tuple<int,_fmt::BasicStringRef<char>,_int,_mp::func::Type> *)0x1ada75);
    local_11 = MatcherBase<int>::Matches(in_stack_00000010,in_stack_0000000c);
  }
  return local_11;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }